

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFirmwareGetFlashProgress(zes_firmware_handle_t hFirmware,uint32_t *pCompletionPercent)

{
  zes_pfnFirmwareGetFlashProgress_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFirmwareGetFlashProgress_t pfnGetFlashProgress;
  uint32_t *pCompletionPercent_local;
  zes_firmware_handle_t hFirmware_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Firmware).pfnGetFlashProgress;
    if (p_Var1 == (zes_pfnFirmwareGetFlashProgress_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFirmware_local._4_4_ = (*p_Var1)(hFirmware,pCompletionPercent);
    }
  }
  else {
    hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFirmware_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFirmwareGetFlashProgress(
    zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
    uint32_t* pCompletionPercent                    ///< [in,out] Pointer to the Completion Percentage of Firmware Update
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFirmwareGetFlashProgress_t pfnGetFlashProgress = [&result] {
        auto pfnGetFlashProgress = ze_lib::context->zesDdiTable.load()->Firmware.pfnGetFlashProgress;
        if( nullptr == pfnGetFlashProgress ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetFlashProgress;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetFlashProgress( hFirmware, pCompletionPercent );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetFlashProgress = ze_lib::context->zesDdiTable.load()->Firmware.pfnGetFlashProgress;
    if( nullptr == pfnGetFlashProgress ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetFlashProgress( hFirmware, pCompletionPercent );
    #endif
}